

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O3

Symbol * __thiscall
anon_unknown.dwarf_412ef0::InstanceBuilder::createInstance
          (InstanceBuilder *this,HierarchicalInstanceSyntax *syntax)

{
  Scope *scope;
  int iVar1;
  InstanceSymbol *this_00;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  size_type extraout_RDX;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation> local_30;
  
  getNameLoc(&local_30,syntax);
  this_00 = slang::BumpAllocator::
            emplace<slang::ast::InstanceSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::Definition_const&,slang::ast::ParameterBuilder&,bool&>
                      (&this->compilation->super_BumpAllocator,this->compilation,&local_30.first,
                       &local_30.second,this->definition,this->paramBuilder,&this->isUninstantiated)
  ;
  iVar1 = slang::SmallVectorBase<int>::copy
                    (&(this->path).super_SmallVectorBase<int>,(EVP_PKEY_CTX *)this->compilation,src)
  ;
  (this_00->super_InstanceSymbolBase).arrayPath.data_ = (pointer)CONCAT44(extraout_var,iVar1);
  (this_00->super_InstanceSymbolBase).arrayPath.size_ = extraout_RDX;
  (this_00->super_InstanceSymbolBase).super_Symbol.originatingSyntax = &syntax->super_SyntaxNode;
  scope = (this->context->scope).ptr;
  if (scope != (Scope *)0x0) {
    slang::ast::Symbol::setAttributes((Symbol *)this_00,scope,this->attributes);
    return (Symbol *)this_00;
  }
  slang::assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,
             "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]"
            );
}

Assistant:

Symbol* createInstance(const HierarchicalInstanceSyntax& syntax) {
        auto [name, loc] = getNameLoc(syntax);
        auto inst = compilation.emplace<InstanceSymbol>(compilation, name, loc, definition,
                                                        paramBuilder, isUninstantiated);

        inst->arrayPath = path.copy(compilation);
        inst->setSyntax(syntax);
        inst->setAttributes(*context.scope, attributes);
        return inst;
    }